

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

bool __thiscall LiteScript::Namespace::DefineVariable(Namespace *this,char *name)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  allocator local_89;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
  local_58;
  
  uVar5 = ((long)(this->vars).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vars).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
  lVar4 = 0;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar5 == uVar3) {
      std::__cxx11::string::string((string *)(local_88 + 0x10),name,&local_89);
      Memory::Create((Memory *)local_88,(Type *)this->memory);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable,_true>
                (&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_88 + 0x10),(Variable *)local_88);
      std::
      vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
      ::emplace_back<std::pair<std::__cxx11::string,LiteScript::Variable>>
                ((vector<std::pair<std::__cxx11::string,LiteScript::Variable>,std::allocator<std::pair<std::__cxx11::string,LiteScript::Variable>>>
                  *)this,&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>
      ::~pair(&local_58);
      Variable::~Variable((Variable *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 0x10));
      break;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((this->vars).
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus
                            + lVar4),name);
    lVar4 = lVar4 + 0x30;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return uVar5 <= uVar3;
}

Assistant:

bool LiteScript::Namespace::DefineVariable(const char *name) {
    for (unsigned int i = 0, sz = this->vars.size(); i < sz; i++) {
        if (this->vars[i].first == name)
            return false;
    }
    this->vars.push_back({ std::string(name), this->memory.Create(Type::NIL) });
    return true;
}